

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void __thiscall Arbiter_Base64_Test::~Arbiter_Base64_Test(Arbiter_Base64_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Arbiter, Base64)
{
    EXPECT_EQ(crypto::encodeBase64(""), "");
    EXPECT_EQ(crypto::encodeBase64("f"), "Zg==");
    EXPECT_EQ(crypto::encodeBase64("fo"), "Zm8=");
    EXPECT_EQ(crypto::encodeBase64("foo"), "Zm9v");
    EXPECT_EQ(crypto::encodeBase64("foob"), "Zm9vYg==");
    EXPECT_EQ(crypto::encodeBase64("fooba"), "Zm9vYmE=");
    EXPECT_EQ(crypto::encodeBase64("foobar"), "Zm9vYmFy");
    EXPECT_EQ(crypto::decodeBase64(""), "");
    EXPECT_EQ(crypto::decodeBase64("Zg=="), "f");
    EXPECT_EQ(crypto::decodeBase64("Zm8="), "fo");
    EXPECT_EQ(crypto::decodeBase64("Zm9v"), "foo");
    EXPECT_EQ(crypto::decodeBase64("Zm9vYg=="), "foob");
    EXPECT_EQ(crypto::decodeBase64("Zm9vYmE="), "fooba");
    EXPECT_EQ(crypto::decodeBase64("Zm9vYmFy"), "foobar");
}